

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

intmax_t config_find_number_fallback(map *config_map,char *key,intmax_t fallback)

{
  int *piVar1;
  map_entry *pmVar2;
  
  pmVar2 = map_get(config_map,key);
  if (((pmVar2 != (map_entry *)0x0) && (piVar1 = (int *)pmVar2->value, piVar1 != (int *)0x0)) &&
     (*piVar1 == 2)) {
    fallback = *(intmax_t *)(piVar1 + 2);
  }
  return fallback;
}

Assistant:

intmax_t config_find_number_fallback(const struct map *config_map, const char *key,
                                     intmax_t fallback)
{
        intmax_t value = 0;

        if (config_find_number(config_map, key, &value) != NO_ERROR) {
                return fallback;
        }

        return value;
}